

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O2

int envy_bios_parse_power_cstep(envy_bios *bios)

{
  uint uVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined8 in_RAX;
  envy_bios_power_cstep_entry2 *peVar8;
  ulong uVar9;
  ulong uVar10;
  uint8_t *res;
  long lVar11;
  undefined8 uStack_38;
  uint16_t tmp;
  
  uVar1 = (bios->power).cstep.offset;
  iVar3 = -0x16;
  if (uVar1 != 0) {
    uStack_38 = in_RAX;
    bios_u8(bios,uVar1,&(bios->power).cstep.version);
    if ((bios->power).cstep.version == '\x10') {
      iVar3 = bios_u8(bios,(bios->power).cstep.offset + 1,&(bios->power).cstep.hlen);
      iVar4 = bios_u8(bios,(bios->power).cstep.offset + 2,&(bios->power).cstep.rlen);
      iVar5 = bios_u8(bios,(bios->power).cstep.offset + 3,&(bios->power).cstep.entriesnum);
      iVar6 = bios_u8(bios,(bios->power).cstep.offset + 4,&(bios->power).cstep.ssz);
      iVar7 = bios_u8(bios,(bios->power).cstep.offset + 5,&(bios->power).cstep.snr);
      (bios->power).cstep.valid =
           iVar7 == 0 && ((iVar6 == 0 && iVar5 == 0) && (iVar4 == 0 && iVar3 == 0));
      bVar2 = (bios->power).cstep.entriesnum;
      if (8 < bVar2) {
        __assert_fail("cstep->entriesnum <= (sizeof(cstep->ent1) / sizeof(struct envy_bios_power_cstep_entry1))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/nvbios/power.c"
                      ,0x245,"int envy_bios_parse_power_cstep(struct envy_bios *)");
      }
      res = &(bios->power).cstep.ent1[0].index;
      for (uVar9 = 0; uVar9 < bVar2; uVar9 = uVar9 + 1) {
        iVar3 = (uint)(bios->power).cstep.hlen + (bios->power).cstep.offset;
        iVar4 = (uint)(bios->power).cstep.rlen * (int)uVar9;
        uVar1 = iVar4 + iVar3;
        bios_u16(bios,uVar1,&tmp);
        ((envy_bios_power_cstep_entry1 *)(res + -5))->offset = uVar1;
        res[-1] = (byte)(tmp >> 5) & 0xf;
        bios_u8(bios,iVar4 + iVar3 + 3,res);
        bVar2 = (bios->power).cstep.entriesnum;
        res = res + 8;
      }
      uVar10 = (ulong)(bios->power).cstep.snr;
      peVar8 = (envy_bios_power_cstep_entry2 *)calloc(1,uVar10 * 0xc);
      (bios->power).cstep.ent2 = peVar8;
      lVar11 = 6;
      iVar3 = 0;
      for (uVar9 = 0; uVar9 < uVar10; uVar9 = uVar9 + 1) {
        iVar5 = (uint)(bios->power).cstep.rlen * (uint)(bios->power).cstep.entriesnum +
                (uint)(bios->power).cstep.hlen + (bios->power).cstep.offset;
        iVar4 = (uint)(bios->power).cstep.ssz * (int)uVar9;
        *(int *)(peVar8->unkn + lVar11 + -0xe) = iVar5 + iVar4;
        bios_u16(bios,iVar5 + iVar4,(uint16_t *)(peVar8->unkn + lVar11 + -8));
        bios_u8(bios,iVar4 + 2 + iVar5,((bios->power).cstep.ent2)->unkn + lVar11 + -6);
        bios_u8(bios,iVar4 + 3 + iVar5,((bios->power).cstep.ent2)->unkn + lVar11 + -5);
        bios_u8(bios,iVar4 + 4 + iVar5,((bios->power).cstep.ent2)->unkn + lVar11 + -4);
        peVar8 = (bios->power).cstep.ent2;
        peVar8->unkn[lVar11 + -10] = *(short *)(peVar8->unkn + lVar11 + -8) != 0;
        uVar10 = (ulong)(bios->power).cstep.snr;
        lVar11 = lVar11 + 0xc;
      }
    }
    else {
      fprintf(_stderr,"Unknown CSTEP table version 0x%x\n");
    }
  }
  return iVar3;
}

Assistant:

int envy_bios_parse_power_cstep(struct envy_bios *bios) {
	struct envy_bios_power_cstep *cstep = &bios->power.cstep;
	int i, err = 0;

	if (!cstep->offset)
		return -EINVAL;

	bios_u8(bios, cstep->offset + 0x0, &cstep->version);
	switch(cstep->version) {
	case 0x10:
		err |= bios_u8(bios, cstep->offset + 0x1, &cstep->hlen);
		err |= bios_u8(bios, cstep->offset + 0x2, &cstep->rlen);
		err |= bios_u8(bios, cstep->offset + 0x3, &cstep->entriesnum);
		err |= bios_u8(bios, cstep->offset + 0x4, &cstep->ssz);
		err |= bios_u8(bios, cstep->offset + 0x5, &cstep->snr);
		cstep->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown CSTEP table version 0x%x\n", cstep->version);
		return -EINVAL;
	};

	assert(cstep->entriesnum <= (sizeof(cstep->ent1) / sizeof(struct envy_bios_power_cstep_entry1)));
	for (i = 0; i < cstep->entriesnum; i++) {
		uint32_t data = cstep->offset + cstep->hlen + i * cstep->rlen;

		uint16_t tmp;
		err |= bios_u16(bios, data + 0x0, &tmp);

		cstep->ent1[i].offset = data;
		cstep->ent1[i].pstate = (tmp & 0x01e0) >> 5;
		bios_u8(bios, data + 0x3, &cstep->ent1[i].index);
	}

	cstep->ent2 = malloc(cstep->snr * sizeof(struct envy_bios_power_cstep_entry2));
	memset(cstep->ent2, 0x0, cstep->snr * sizeof(struct envy_bios_power_cstep_entry2));
	for (i = 0; i < cstep->snr; i++) {
		uint32_t data = cstep->offset + cstep->hlen + (cstep->entriesnum * cstep->rlen) + (i * cstep->ssz);

		cstep->ent2[i].offset = data;
		bios_u16(bios, data + 0x0, &cstep->ent2[i].freq);
		bios_u8(bios, data + 0x2, &cstep->ent2[i].unkn[0]);
		bios_u8(bios, data + 0x3, &cstep->ent2[i].unkn[1]);
		bios_u8(bios, data + 0x4, &cstep->ent2[i].voltage);
		cstep->ent2[i].valid = (cstep->ent2[i].freq > 0);
	}

	return 0;
}